

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O0

void __thiscall
capnp::EzRpcServer::Impl::acceptLoop
          (Impl *this,Own<kj::ConnectionReceiver> *listener,ReaderOptions readerOpts)

{
  Type *func;
  Own<kj::ConnectionReceiver> *this_00;
  Own<kj::ConnectionReceiver> local_90;
  int local_80;
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_ez_rpc_c__:294:9),_kj::Own<kj::ConnectionReceiver>_>
  local_78;
  undefined1 local_50 [16];
  Promise<void> local_40;
  Type *local_30;
  ConnectionReceiver *ptr;
  Own<kj::ConnectionReceiver> *listener_local;
  Impl *this_local;
  ReaderOptions readerOpts_local;
  
  this_local = (Impl *)readerOpts.traversalLimitInWords;
  readerOpts_local.traversalLimitInWords._0_4_ = readerOpts.nestingLimit;
  ptr = (ConnectionReceiver *)listener;
  listener_local = (Own<kj::ConnectionReceiver> *)this;
  func = (Type *)kj::Own<kj::ConnectionReceiver>::get(listener);
  local_30 = func;
  (*(code *)(func->this->super_SturdyRefRestorer<capnp::AnyPointer>).super_SturdyRefRestorerBase.
            _vptr_SturdyRefRestorerBase)(local_50);
  this_00 = kj::mv<kj::Own<kj::ConnectionReceiver>>((Own<kj::ConnectionReceiver> *)ptr);
  local_80 = (int)readerOpts_local.traversalLimitInWords;
  local_90.ptr = (ConnectionReceiver *)this_local;
  local_90.disposer = (Disposer *)this;
  kj::
  mvCapture<capnp::EzRpcServer::Impl::acceptLoop(kj::Own<kj::ConnectionReceiver>&&,capnp::ReaderOptions)::_lambda(kj::Own<kj::ConnectionReceiver>&&,kj::Own<kj::AsyncIoStream>&&)_1_,kj::Own<kj::ConnectionReceiver>>
            (&local_78,(kj *)this_00,&local_90,func);
  kj::Promise<kj::Own<kj::AsyncIoStream>>::
  then<kj::CaptureByMove<capnp::EzRpcServer::Impl::acceptLoop(kj::Own<kj::ConnectionReceiver>&&,capnp::ReaderOptions)::_lambda(kj::Own<kj::ConnectionReceiver>&&,kj::Own<kj::AsyncIoStream>&&)_1_,kj::Own<kj::ConnectionReceiver>>,kj::_::PropagateException>
            ((Promise<kj::Own<kj::AsyncIoStream>> *)&local_40,
             (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_ez_rpc_c__:294:9),_kj::Own<kj::ConnectionReceiver>_>
              *)local_50,(PropagateException *)&local_78);
  kj::TaskSet::add(&this->tasks,&local_40);
  kj::Promise<void>::~Promise(&local_40);
  kj::
  CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc.c++:294:9),_kj::Own<kj::ConnectionReceiver>_>
  ::~CaptureByMove(&local_78);
  kj::Promise<kj::Own<kj::AsyncIoStream>_>::~Promise
            ((Promise<kj::Own<kj::AsyncIoStream>_> *)local_50);
  return;
}

Assistant:

void acceptLoop(kj::Own<kj::ConnectionReceiver>&& listener, ReaderOptions readerOpts) {
    auto ptr = listener.get();
    tasks.add(ptr->accept().then(kj::mvCapture(kj::mv(listener),
        [this, readerOpts](kj::Own<kj::ConnectionReceiver>&& listener,
                           kj::Own<kj::AsyncIoStream>&& connection) {
      acceptLoop(kj::mv(listener), readerOpts);

      auto server = kj::heap<ServerContext>(kj::mv(connection), *this, readerOpts);

      // Arrange to destroy the server context when all references are gone, or when the
      // EzRpcServer is destroyed (which will destroy the TaskSet).
      tasks.add(server->network.onDisconnect().attach(kj::mv(server)));
    })));
  }